

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_bool,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_bool,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  ApplyFunc *pAVar1;
  Expr<float> *pEVar2;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar3;
  undefined1 local_99;
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  pAVar1 = this->m_func;
  (*(((this->m_args).a.super_ExprPBase<bool>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.m_ptr)->super_ExprBase).
    _vptr_ExprBase[4])(local_98);
  pEVar2 = (this->m_args).b.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(local_68,pEVar2,ctx);
  pEVar2 = (this->m_args).c.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(local_80,pEVar2,ctx);
  pEVar3 = (this->m_args).d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(pEVar3,ctx);
  local_50 = local_98;
  local_38 = &local_99;
  local_48 = local_68;
  local_40 = local_80;
  (**(code **)(*(long *)pAVar1 + 0x40))(__return_storage_ptr__,pAVar1,ctx);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}